

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O1

void __thiscall
ImDrawList::AddTriangle(ImDrawList *this,ImVec2 *a,ImVec2 *b,ImVec2 *c,ImU32 col,float thickness)

{
  int *piVar1;
  int iVar2;
  ImVec2 *pIVar3;
  ImGuiContext *pIVar4;
  ImVec2 *pIVar5;
  int iVar6;
  uint uVar7;
  int iVar8;
  ulong uVar9;
  
  pIVar4 = GImGui;
  if (0xffffff < col) {
    iVar8 = (this->_Path).Size;
    iVar2 = (this->_Path).Capacity;
    if (iVar8 == iVar2) {
      iVar8 = iVar8 + 1;
      if (iVar2 == 0) {
        iVar6 = 8;
      }
      else {
        iVar6 = iVar2 / 2 + iVar2;
      }
      if (iVar8 < iVar6) {
        iVar8 = iVar6;
      }
      if (iVar2 < iVar8) {
        piVar1 = &(GImGui->IO).MetricsAllocs;
        *piVar1 = *piVar1 + 1;
        pIVar5 = (ImVec2 *)(*(pIVar4->IO).MemAllocFn)((long)iVar8 << 3);
        pIVar3 = (this->_Path).Data;
        if (pIVar3 != (ImVec2 *)0x0) {
          memcpy(pIVar5,pIVar3,(long)(this->_Path).Size << 3);
        }
        pIVar3 = (this->_Path).Data;
        if (pIVar3 != (ImVec2 *)0x0) {
          piVar1 = &(GImGui->IO).MetricsAllocs;
          *piVar1 = *piVar1 + -1;
        }
        (*(GImGui->IO).MemFreeFn)(pIVar3);
        (this->_Path).Data = pIVar5;
        (this->_Path).Capacity = iVar8;
      }
    }
    iVar8 = (this->_Path).Size;
    (this->_Path).Size = iVar8 + 1;
    (this->_Path).Data[iVar8] = *a;
    pIVar4 = GImGui;
    iVar8 = (this->_Path).Size;
    iVar2 = (this->_Path).Capacity;
    if (iVar8 == iVar2) {
      iVar8 = iVar8 + 1;
      if (iVar2 == 0) {
        iVar6 = 8;
      }
      else {
        iVar6 = iVar2 / 2 + iVar2;
      }
      if (iVar8 < iVar6) {
        iVar8 = iVar6;
      }
      if (iVar2 < iVar8) {
        piVar1 = &(GImGui->IO).MetricsAllocs;
        *piVar1 = *piVar1 + 1;
        pIVar5 = (ImVec2 *)(*(pIVar4->IO).MemAllocFn)((long)iVar8 << 3);
        pIVar3 = (this->_Path).Data;
        if (pIVar3 != (ImVec2 *)0x0) {
          memcpy(pIVar5,pIVar3,(long)(this->_Path).Size << 3);
        }
        pIVar3 = (this->_Path).Data;
        if (pIVar3 != (ImVec2 *)0x0) {
          piVar1 = &(GImGui->IO).MetricsAllocs;
          *piVar1 = *piVar1 + -1;
        }
        (*(GImGui->IO).MemFreeFn)(pIVar3);
        (this->_Path).Data = pIVar5;
        (this->_Path).Capacity = iVar8;
      }
    }
    iVar8 = (this->_Path).Size;
    (this->_Path).Size = iVar8 + 1;
    (this->_Path).Data[iVar8] = *b;
    pIVar4 = GImGui;
    iVar8 = (this->_Path).Size;
    iVar2 = (this->_Path).Capacity;
    if (iVar8 == iVar2) {
      iVar8 = iVar8 + 1;
      if (iVar2 == 0) {
        iVar6 = 8;
      }
      else {
        iVar6 = iVar2 / 2 + iVar2;
      }
      if (iVar8 < iVar6) {
        iVar8 = iVar6;
      }
      if (iVar2 < iVar8) {
        piVar1 = &(GImGui->IO).MetricsAllocs;
        *piVar1 = *piVar1 + 1;
        pIVar5 = (ImVec2 *)(*(pIVar4->IO).MemAllocFn)((long)iVar8 << 3);
        pIVar3 = (this->_Path).Data;
        if (pIVar3 != (ImVec2 *)0x0) {
          memcpy(pIVar5,pIVar3,(long)(this->_Path).Size << 3);
        }
        pIVar3 = (this->_Path).Data;
        if (pIVar3 != (ImVec2 *)0x0) {
          piVar1 = &(GImGui->IO).MetricsAllocs;
          *piVar1 = *piVar1 + -1;
        }
        (*(GImGui->IO).MemFreeFn)(pIVar3);
        (this->_Path).Data = pIVar5;
        (this->_Path).Capacity = iVar8;
      }
    }
    iVar8 = (this->_Path).Size;
    (this->_Path).Size = iVar8 + 1;
    (this->_Path).Data[iVar8] = *c;
    AddPolyline(this,(this->_Path).Data,(this->_Path).Size,col,true,thickness,true);
    pIVar4 = GImGui;
    iVar8 = (this->_Path).Capacity;
    if (iVar8 < 0) {
      uVar7 = iVar8 / 2 + iVar8;
      uVar9 = 0;
      if (0 < (int)uVar7) {
        uVar9 = (ulong)uVar7;
      }
      piVar1 = &(GImGui->IO).MetricsAllocs;
      *piVar1 = *piVar1 + 1;
      pIVar5 = (ImVec2 *)(*(pIVar4->IO).MemAllocFn)(uVar9 * 8);
      pIVar3 = (this->_Path).Data;
      if (pIVar3 != (ImVec2 *)0x0) {
        memcpy(pIVar5,pIVar3,(long)(this->_Path).Size << 3);
      }
      pIVar3 = (this->_Path).Data;
      if (pIVar3 != (ImVec2 *)0x0) {
        piVar1 = &(GImGui->IO).MetricsAllocs;
        *piVar1 = *piVar1 + -1;
      }
      (*(GImGui->IO).MemFreeFn)(pIVar3);
      (this->_Path).Data = pIVar5;
      (this->_Path).Capacity = (int)uVar9;
    }
    (this->_Path).Size = 0;
  }
  return;
}

Assistant:

void ImDrawList::AddTriangle(const ImVec2& a, const ImVec2& b, const ImVec2& c, ImU32 col, float thickness)
{
    if ((col >> 24) == 0)
        return;

    PathLineTo(a);
    PathLineTo(b);
    PathLineTo(c);
    PathStroke(col, true, thickness);
}